

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::AssignUInt64(Bignum *this,uint64_t value)

{
  uint *puVar1;
  int i;
  long lVar2;
  ulong uVar3;
  
  if (0 < this->used_digits_) {
    puVar1 = (this->bigits_).start_;
    lVar2 = 0;
    do {
      puVar1[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->used_digits_);
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  if (value == 0) {
    return;
  }
  puVar1 = (this->bigits_).start_;
  lVar2 = 0;
  do {
    puVar1[lVar2] = (uint)value & 0xfffffff;
    value = value >> 0x1c;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  this->used_digits_ = 3;
  puVar1 = (this->bigits_).start_;
  lVar2 = 2;
  do {
    if (puVar1[lVar2] != 0) {
      if (lVar2 != -1) {
        return;
      }
      break;
    }
    this->used_digits_ = (int)lVar2;
    uVar3 = lVar2 + 1;
    lVar2 = lVar2 + -1;
  } while (1 < uVar3);
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Zero() {
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = 0;
  exponent_ = 0;
}